

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# week8-midterm.cpp
# Opt level: O0

void print<std::__cxx11::string,unsigned_long>
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                *m)

{
  bool bVar1;
  reference __in;
  type *ptVar2;
  type_conflict *value_00;
  ostream *poVar3;
  type *value;
  type *key;
  _Self local_28;
  const_iterator __end0;
  const_iterator __begin0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  *__range1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  *m_local;
  
  __end0 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
           ::begin(m);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
       ::end(m);
  while( true ) {
    bVar1 = std::operator==(&__end0,&local_28);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    __in = std::
           _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
           ::operator*(&__end0);
    ptVar2 = std::get<0ul,std::__cxx11::string_const,unsigned_long>(__in);
    value_00 = std::get<1ul,std::__cxx11::string_const,unsigned_long>(__in);
    poVar3 = std::operator<<((ostream *)&std::cout,"<");
    poVar3 = std::operator<<(poVar3,(string *)ptVar2);
    std::operator<<(poVar3,">: ");
    print<unsigned_long>(value_00);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
    ::operator++(&__end0);
  }
  return;
}

Assistant:

void print(const std::map<Key, Value>& m)
{
    for(const auto& [key, value] : m)
    {
        std::cout << "<" << key << ">: ";
        print(value);
    }
}